

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

CompiledModule * __thiscall
capnp::compiler::Compiler::Impl::addInternal(Impl *this,Module *parsedModule)

{
  CompiledModule *pCVar1;
  RefOrVoid<capnp::compiler::Compiler::CompiledModule> pCVar2;
  Own<capnp::compiler::Compiler::CompiledModule> local_38;
  Module *local_28;
  mapped_type *local_20;
  Own<capnp::compiler::Compiler::CompiledModule> *slot;
  Module *parsedModule_local;
  Impl *this_local;
  
  local_28 = parsedModule;
  slot = (Own<capnp::compiler::Compiler::CompiledModule> *)parsedModule;
  parsedModule_local = (Module *)this;
  local_20 = std::
             unordered_map<capnp::compiler::Module_*,_kj::Own<capnp::compiler::Compiler::CompiledModule>,_std::hash<capnp::compiler::Module_*>,_std::equal_to<capnp::compiler::Module_*>,_std::allocator<std::pair<capnp::compiler::Module_*const,_kj::Own<capnp::compiler::Compiler::CompiledModule>_>_>_>
             ::operator[](&this->modules,&local_28);
  pCVar1 = kj::Own<capnp::compiler::Compiler::CompiledModule>::get(local_20);
  if (pCVar1 == (CompiledModule *)0x0) {
    kj::
    heap<capnp::compiler::Compiler::CompiledModule,capnp::compiler::Compiler::Impl&,capnp::compiler::Module&>
              ((kj *)&local_38,this,(Module *)slot);
    kj::Own<capnp::compiler::Compiler::CompiledModule>::operator=(local_20,&local_38);
    kj::Own<capnp::compiler::Compiler::CompiledModule>::~Own(&local_38);
  }
  pCVar2 = kj::Own<capnp::compiler::Compiler::CompiledModule>::operator*(local_20);
  return pCVar2;
}

Assistant:

Compiler::CompiledModule& Compiler::Impl::addInternal(Module& parsedModule) {
  kj::Own<CompiledModule>& slot = modules[&parsedModule];
  if (slot.get() == nullptr) {
    slot = kj::heap<CompiledModule>(*this, parsedModule);
  }

  return *slot;
}